

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSpecialFloatTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles3::Stress::(anonymous_namespace)::OutputCase::genFragmentSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "#version 300 es\nlayout(location = 0) out highp vec4 fragColor;\nuniform highp float u_special;\nin highp vec2 v_pos;\nvoid main ()\n{\n\tfragColor = vec4((v_pos.x + 1.0) * 0.5, u_special, (v_pos.y + 1.0) * 0.5, 1.0);\n}\n"
             ,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string OutputCase::genFragmentSource (void) const
{
	return
		"#version 300 es\n"
		"layout(location = 0) out highp vec4 fragColor;\n"
		"uniform highp float u_special;\n"
		"in highp vec2 v_pos;\n"
		"void main ()\n"
		"{\n"
		"	fragColor = vec4((v_pos.x + 1.0) * 0.5, u_special, (v_pos.y + 1.0) * 0.5, 1.0);\n"
		"}\n";
}